

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamahaCommands.hpp
# Opt level: O2

bool __thiscall
TI::TMS::Commands::Rectangle<true,_false>::advance_pixel(Rectangle<true,_false> *this)

{
  int *piVar1;
  CommandContext *pCVar2;
  int iVar3;
  
  Command::advance_axis<0,false>(&this->super_Command,1);
  pCVar2 = (this->super_Command).context;
  iVar3 = (pCVar2->size).v[0] + -1;
  (pCVar2->size).v[0] = iVar3;
  if (iVar3 == 0) {
    (pCVar2->size).v[0] = this->width_;
    (pCVar2->destination).v[0] = this->start_x_[1];
    Command::advance_axis<1,false>(&this->super_Command,1);
    piVar1 = (((this->super_Command).context)->size).v + 1;
    *piVar1 = *piVar1 + -1;
  }
  return iVar3 == 0;
}

Assistant:

bool advance_pixel() {
			if constexpr (logical) {
				advance_axis<0, include_source>();
				--context.size.v[0];

				if(context.size.v[0]) {
					return false;
				}
			} else {
				advance_axis<0, include_source>(mode_description.pixels_per_byte);
				context.size.v[0] -= mode_description.pixels_per_byte;

				if(context.size.v[0] & ~(mode_description.pixels_per_byte - 1)) {
					return false;
				}
			}

			context.size.v[0] = width_;
			if constexpr (include_source) {
				context.source.v[0] = start_x_[0];
			}
			context.destination.v[0] = start_x_[1];

			advance_axis<1, include_source>();
			--context.size.v[1];

			return true;
		}